

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprCachePop(Parse *pParse,int N)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  
  pParse->iCacheLevel = pParse->iCacheLevel + -1;
  lVar3 = 0;
  do {
    iVar2 = *(int *)((long)&pParse->aColCache[0].iReg + lVar3);
    if ((iVar2 != 0) && (pParse->iCacheLevel < *(int *)((long)&pParse->aColCache[0].iLevel + lVar3))
       ) {
      if ((&pParse->aColCache[0].tempReg)[lVar3] != '\0') {
        bVar1 = pParse->nTempReg;
        if ((ulong)bVar1 < 8) {
          pParse->nTempReg = bVar1 + 1;
          pParse->aTempReg[bVar1] = iVar2;
        }
        (&pParse->aColCache[0].tempReg)[lVar3] = '\0';
      }
      *(undefined4 *)((long)&pParse->aColCache[0].iReg + lVar3) = 0;
    }
    lVar3 = lVar3 + 0x18;
  } while ((int)lVar3 != 0xf0);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCachePop(Parse *pParse, int N){
  int i;
  struct yColCache *p;
  assert( N>0 );
  assert( pParse->iCacheLevel>=N );
  pParse->iCacheLevel -= N;
  for(i=0, p=pParse->aColCache; i<SQLITE_N_COLCACHE; i++, p++){
    if( p->iReg && p->iLevel>pParse->iCacheLevel ){
      cacheEntryClear(pParse, p);
      p->iReg = 0;
    }
  }
}